

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::ByteCodeWriter::TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint32 slotId,
          RegSlot homeObj)

{
  bool bVar1;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((((DAT_0143bfdd == '\0') && (local_e = (undefined2)value, value < 0x10000)) &&
      (local_c = (undefined2)instance, instance < 0x10000)) &&
     ((local_10 = (undefined2)slotId, slotId < 0x10000 &&
      (local_a = (undefined2)homeObj, homeObj < 0x10000)))) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,&local_10,8,this);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteElementSlotI3(OpCode op, RegSlot value, RegSlot instance, uint32 slotId, RegSlot homeObj)
    {
        OpLayoutT_ElementSlotI3<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value)
            && SizePolicy::Assign(layout.Instance, instance)
            && SizePolicy::Assign(layout.SlotIndex, slotId)
            && SizePolicy::Assign(layout.HomeObj, homeObj))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }